

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::addStructBufferHiddenCounterParam
          (HlslParseContext *this,TSourceLoc *loc,TParameter *param,TIntermAggregate **paramNodes)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  TVariable *variable_00;
  undefined4 extraout_var;
  char *pcVar3;
  TIntermSymbol *right;
  TIntermAggregate *pTVar4;
  TVariable *variable;
  TType counterType;
  TString counterBlockName;
  TIntermAggregate **paramNodes_local;
  TParameter *param_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  bVar1 = hasStructBuffCounter(this,param->type);
  if (bVar1) {
    TIntermediate::
    addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &counterType.spirvType,
               (this->super_TParseContextBase).super_TParseVersions.intermediate,param->name);
    TType::TType((TType *)&variable,EbtVoid,EvqTemporary,1,0,0,false);
    counterBufferType(this,loc,(TType *)&variable);
    variable_00 = makeInternalVariable(this,(TString *)&counterType.spirvType,(TType *)&variable);
    bVar1 = TSymbolTable::insert
                      ((this->super_TParseContextBase).symbolTable,&variable_00->super_TSymbol);
    if (!bVar1) {
      iVar2 = (*(variable_00->super_TSymbol)._vptr_TSymbol[3])();
      pcVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"redefinition",pcVar3,"");
    }
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar4 = *paramNodes;
    right = TIntermediate::addSymbol
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable_00
                       ,loc);
    pTVar4 = TIntermediate::growAggregate(this_00,(TIntermNode *)pTVar4,(TIntermNode *)right,loc);
    *paramNodes = pTVar4;
    TType::~TType((TType *)&variable);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  &counterType.spirvType);
  }
  return;
}

Assistant:

void HlslParseContext::addStructBufferHiddenCounterParam(const TSourceLoc& loc, TParameter& param,
                                                         TIntermAggregate*& paramNodes)
{
    if (! hasStructBuffCounter(*param.type))
        return;

    const TString counterBlockName(intermediate.addCounterBufferName(*param.name));

    TType counterType;
    counterBufferType(loc, counterType);
    TVariable *variable = makeInternalVariable(counterBlockName, counterType);

    if (! symbolTable.insert(*variable))
        error(loc, "redefinition", variable->getName().c_str(), "");

    paramNodes = intermediate.growAggregate(paramNodes,
                                            intermediate.addSymbol(*variable, loc),
                                            loc);
}